

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O2

string * PrintStringToBIO_abi_cxx11_
                   (string *__return_storage_ptr__,ASN1_STRING *str,
                   _func_int_BIO_ptr_ASN1_STRING_ptr *print_func)

{
  int iVar1;
  BIO_METHOD *type;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertHelper local_38;
  UniquePtr<BIO> bio;
  size_t len;
  uint8_t *data;
  
  type = BIO_s_mem();
  bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)BIO_new(type);
  if ((tuple<bio_st_*,_bssl::internal::Deleter>)
      bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl != (_Head_base<0UL,_bio_st_*,_false>)0x0)
  {
    iVar1 = (*print_func)((BIO *)bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,str);
    if (iVar1 != 0) {
      iVar1 = BIO_mem_contents((BIO *)bio._M_t.
                                      super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,&data,&len
                              );
      if (iVar1 != 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<unsigned_char_const*>
                  ((string *)__return_storage_ptr__,data,data + len);
        goto LAB_001b09df;
      }
    }
  }
  testing::Message::Message((Message *)&local_40);
  std::operator<<((ostream *)(local_40._M_head_impl + 0x10),"Could not print to BIO");
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
             ,0x3d1,"Failed");
  testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if (local_40._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_40);
LAB_001b09df:
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&bio);
  return __return_storage_ptr__;
}

Assistant:

static std::string PrintStringToBIO(const ASN1_STRING *str,
                                    int (*print_func)(BIO *,
                                                      const ASN1_STRING *)) {
  const uint8_t *data;
  size_t len;
  bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_mem()));
  if (!bio ||  //
      !print_func(bio.get(), str) ||
      !BIO_mem_contents(bio.get(), &data, &len)) {
    ADD_FAILURE() << "Could not print to BIO";
    return "";
  }
  return std::string(data, data + len);
}